

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

void __thiscall BmsParser::Parser::Clear(Parser *this)

{
  this->line_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->line_data_);
  std::ios::clear((int)this + 0x88 + (int)*(undefined8 *)(*(long *)&this->log_ + -0x18));
  memset(this->bgm_dup_count,0,4000);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->syntax_tag_);
  this->panic_ = false;
  return;
}

Assistant:

void Parser::Clear() {
		line_ = 0;
		line_data_.clear();
		log_.clear();
		memset(bgm_dup_count, 0, sizeof(bgm_dup_count));

		syntax_tag_.clear();
		panic_ = false;
	}